

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  size_t *__k;
  int iVar1;
  char cVar2;
  int iVar3;
  istream *this;
  ostream *poVar4;
  mapped_type *pmVar5;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *pmVar6;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *pmVar7;
  long lVar8;
  ulong uVar9;
  pointer pcVar10;
  long lVar11;
  undefined1 local_f8 [8];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> char2index;
  long local_b8 [2];
  size_type *local_a8;
  string text;
  string line;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  letters;
  int local_44;
  long lStack_40;
  int width;
  int local_34 [2];
  int height;
  
  local_a8 = &text._M_string_length;
  text._M_dataplus._M_p = (pointer)0x0;
  text._M_string_length._0_1_ = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_44);
  std::istream::operator>>(this,local_34);
  std::istream::ignore();
  cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x20);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_a8,cVar2);
  line.field_2._8_8_ = 0;
  char2index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&char2index;
  char2index._M_t._M_impl._0_4_ = 0;
  char2index._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  char2index._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  char2index._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  char2index._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       char2index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::resize((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)((long)&line.field_2 + 8),0x1b);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_a8,(long)text._M_dataplus._M_p);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (0 < local_34[0]) {
    lVar8 = 0;
    __k = &char2index._M_t._M_impl.super__Rb_tree_header._M_node_count;
    do {
      text.field_2._8_8_ = &line._M_string_length;
      line._M_dataplus._M_p = (pointer)0x0;
      line._M_string_length._0_1_ = 0;
      cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -0x20);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)(text.field_2._M_local_buf + 8),cVar2);
      if (line.field_2._8_8_ != 0) {
        lVar11 = 0;
        uVar9 = 0;
        do {
          if (lVar8 == 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(line.field_2._8_8_ + lVar11),(long)local_34[0]);
            char2index._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
                 (int)"ABCDEFGHIJKLMNOPQRSTUVWXYZ?"[uVar9];
            pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)local_f8,(key_type *)__k);
            *pmVar5 = (mapped_type)uVar9;
          }
          std::__cxx11::string::substr((ulong)__k,(ulong)((long)&text.field_2 + 8));
          std::__cxx11::string::operator=
                    ((string *)(*(long *)(line.field_2._8_8_ + lVar11) + lVar8 * 0x20),(string *)__k
                    );
          if ((long *)CONCAT44(char2index._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                               (int)char2index._M_t._M_impl.super__Rb_tree_header._M_node_count) !=
              local_b8) {
            operator_delete((long *)CONCAT44(char2index._M_t._M_impl.super__Rb_tree_header.
                                             _M_node_count._4_4_,
                                             (int)char2index._M_t._M_impl.super__Rb_tree_header.
                                                  _M_node_count),local_b8[0] + 1);
          }
          uVar9 = uVar9 + 1;
          lVar11 = lVar11 + 0x18;
        } while (uVar9 < (ulong)(((long)-line.field_2._8_8_ >> 3) * -0x5555555555555555));
      }
      if ((size_type *)text.field_2._8_8_ != &line._M_string_length) {
        operator_delete((void *)text.field_2._8_8_,
                        CONCAT71(line._M_string_length._1_7_,(undefined1)line._M_string_length) + 1)
        ;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < local_34[0]);
  }
  if (0 < local_34[0]) {
    lVar8 = 0;
    do {
      lVar11 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   *(char **)(*(long *)(line.field_2._8_8_ + lVar11) + lVar8 * 0x20),
                   *(long *)(*(long *)(line.field_2._8_8_ + lVar11) + 8 + lVar8 * 0x20));
        lVar11 = lVar11 + 0x18;
      } while (lVar11 != 0x288);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\b');
      std::ostream::put('\b');
      std::ostream::flush();
      lVar8 = lVar8 + 1;
    } while (lVar8 < local_34[0]);
  }
  if (0 < local_34[0]) {
    lStack_40 = 0;
    do {
      if (text._M_dataplus._M_p != (pointer)0x0) {
        lVar8 = lStack_40 * 0x20;
        pcVar10 = (pointer)0x0;
        do {
          iVar3 = toupper((int)*(char *)((long)local_a8 + (long)pcVar10));
          text.field_2._8_4_ = iVar3;
          pmVar6 = &char2index;
          for (pmVar7 = (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)char2index._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
              pmVar7 != (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)0x0;
              pmVar7 = (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )(&(pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent)
                        [iVar1 < iVar3]) {
            iVar1 = *(int *)&(pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
            if (iVar3 <= iVar1) {
              pmVar6 = pmVar7;
            }
          }
          pmVar7 = &char2index;
          if ((pmVar6 != &char2index) &&
             (pmVar7 = pmVar6,
             iVar3 < *(int *)&(pmVar6->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right)) {
            pmVar7 = &char2index;
          }
          if (pmVar7 == &char2index) {
            char2index._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0x3f;
            pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)local_f8,
                                  (key_type *)
                                  &char2index._M_t._M_impl.super__Rb_tree_header._M_node_count);
            lVar11 = *(long *)(line.field_2._8_8_ + (long)*pmVar5 * 0x18);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,*(char **)(lVar11 + lVar8),
                       *(long *)(lVar11 + 8 + lVar8));
          }
          else {
            pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)local_f8,(key_type *)(text.field_2._M_local_buf + 8));
            lVar11 = *(long *)(line.field_2._8_8_ + (long)*pmVar5 * 0x18);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,*(char **)(lVar11 + lVar8),
                       *(long *)(lVar11 + 8 + lVar8));
          }
          pcVar10 = pcVar10 + 1;
        } while (pcVar10 < text._M_dataplus._M_p);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      lStack_40 = lStack_40 + 1;
    } while (lStack_40 < local_34[0]);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)local_f8);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector((vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             *)((long)&line.field_2 + 8));
  if (local_a8 != &text._M_string_length) {
    operator_delete(local_a8,CONCAT71(text._M_string_length._1_7_,(undefined1)text._M_string_length)
                             + 1);
  }
  return 0;
}

Assistant:

int main()
{
        int width, height;
        std::string text;
        std::cin >> width >> height;
        std::cin.ignore();
        getline(std::cin, text);

        char chars[] = "ABCDEFGHIJKLMNOPQRSTUVWXYZ?";
        std::vector<std::vector<std::string> > letters;
        std::map<int, int> char2index;
        letters.resize(strlen(chars));
        std::cerr << text << std::endl;
        for (int l = 0; l < height; l++)
        {
                std::string line;
                getline(std::cin, line);
                //std::cerr << line << std::endl;

                for (size_t c = 0; c < letters.size(); c++)
                {
                    if (0 == l)
                    {
                        letters[c].resize(height);
                        char2index[chars[c]] = c;
                    }
                    letters[c][l] = line.substr(c*width, width);
                }
        }

        for (int l = 0; l < height; l++)
        {
            for (size_t c = 0; c < strlen(chars); c++)
            {
                std::cerr << letters[c][l];
            }
            std::cerr << std::endl;
        }

        for (int i = 0; i < height; i++)
        {
            for (size_t j = 0; j < text.length(); j++)
            {
                int c = toupper(text[j]);
                if (char2index.find(c) != char2index.end())
                {
                    std::cout << letters[char2index[c]][i];
                } else
                {
                    std::cout << letters[char2index['?']][i];
                }
            }
            std::cout << std::endl;
        }

        return 0;
}